

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkPreparing(ConsoleReporter *this,string *name)

{
  bool bVar1;
  bool bVar2;
  pointer this_00;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *this_01;
  const_reference pvVar3;
  Column *pCVar4;
  type pTVar5;
  TablePrinter *pTVar6;
  undefined1 local_110 [8];
  string line;
  iterator __end1;
  iterator __begin1;
  Column *__range1;
  bool firstLine;
  Column local_78;
  undefined1 local_48 [8];
  Column nameCol;
  string *name_local;
  ConsoleReporter *this_local;
  
  nameCol.m_initialIndent = (size_t)name;
  lazyPrintWithoutClosingBenchmarkTable(this);
  clara::TextFlow::Column::Column(&local_78,(string *)nameCol.m_initialIndent);
  this_00 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
            operator->(&this->m_tablePrinter);
  this_01 = TablePrinter::columnInfos(this_00);
  pvVar3 = clara::std::
           vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ::operator[](this_01,0);
  pCVar4 = clara::TextFlow::Column::width(&local_78,(long)(pvVar3->width + -2));
  clara::TextFlow::Column::Column((Column *)local_48,pCVar4);
  clara::TextFlow::Column::~Column(&local_78);
  bVar1 = true;
  clara::TextFlow::Column::begin((iterator *)&__end1.m_suffix,(Column *)local_48);
  clara::TextFlow::Column::end((iterator *)((long)&line.field_2 + 8),(Column *)local_48);
  while( true ) {
    bVar2 = clara::TextFlow::Column::iterator::operator!=
                      ((iterator *)&__end1.m_suffix,(iterator *)((long)&line.field_2 + 8));
    if (!bVar2) break;
    clara::TextFlow::Column::iterator::operator*[abi_cxx11_
              ((string *)local_110,(iterator *)&__end1.m_suffix);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      pTVar5 = clara::std::
               unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::operator*
                         (&this->m_tablePrinter);
      pTVar6 = Catch::operator<<(pTVar5);
      pTVar6 = Catch::operator<<(pTVar6);
      Catch::operator<<(pTVar6);
    }
    pTVar5 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
             ::operator*(&this->m_tablePrinter);
    pTVar6 = Catch::operator<<(pTVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_110);
    Catch::operator<<(pTVar6);
    std::__cxx11::string::~string((string *)local_110);
    clara::TextFlow::Column::iterator::operator++((iterator *)&__end1.m_suffix);
  }
  clara::TextFlow::Column::~Column((Column *)local_48);
  return;
}

Assistant:

void ConsoleReporter::benchmarkPreparing(std::string const& name) {
	lazyPrintWithoutClosingBenchmarkTable();

	auto nameCol = Column(name).width(static_cast<std::size_t>(m_tablePrinter->columnInfos()[0].width - 2));

	bool firstLine = true;
	for (auto line : nameCol) {
		if (!firstLine)
			(*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
		else
			firstLine = false;

		(*m_tablePrinter) << line << ColumnBreak();
	}
}